

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall
IRBuilder::BuildArg(IRBuilder *this,OpCode newOpcode,uint32 offset,ArgSlot argument,
                   RegSlot srcRegSlot)

{
  RealCount *pRVar1;
  SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  StackSym *sym;
  SymOpnd *dstOpnd;
  RegOpnd *src1Opnd;
  Instr *instr;
  Type pSVar6;
  OpCode opcode;
  IRType type;
  
  bVar4 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x17ba,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar4) goto LAB_004db0e8;
    *puVar5 = 0;
  }
  this->m_argsOnStack = this->m_argsOnStack + 1;
  if (argument == 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x17c6,"(argument < 0xffff)","argument < USHRT_MAX");
    if (!bVar4) goto LAB_004db0e8;
    *puVar5 = 0;
  }
  sym = SymTable::GetArgSlotSym(this->m_func->m_symTable,argument + 1);
  if ((argument != 0xffff) && (sym != (StackSym *)0x0)) {
    opcode = ArgOut_A;
    if (newOpcode != ArgOut_ANonVar) {
      opcode = newOpcode;
    }
    type = TyVar;
    if (newOpcode == ArgOut_ANonVar) {
      type = TyUint64;
    }
    dstOpnd = IR::SymOpnd::New(&sym->super_Sym,type,this->m_func);
    src1Opnd = BuildSrcOpnd(this,srcRegSlot,type);
    instr = IR::Instr::New(opcode,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
    AddInstr(this,instr,offset);
    pSVar2 = this->m_argStack;
    pSVar6 = (Type)new<Memory::ArenaAllocator>(0x10,pSVar2->allocator,0x366bee);
    pSVar6[1].next = (Type)instr;
    pSVar6->next = (pSVar2->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
                   super_SListNodeBase<Memory::ArenaAllocator>.next;
    (pSVar2->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
    super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar6;
    pRVar1 = &(pSVar2->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
              super_RealCount;
    pRVar1->count = pRVar1->count + 1;
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar5 = 1;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                     ,0x17ca,"((0))","Arg count too big...");
  if (bVar4) {
    *puVar5 = 0;
    Js::Throw::FatalInternalError(-0x7fffbffb);
  }
LAB_004db0e8:
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void
IRBuilder::BuildArg(Js::OpCode newOpcode, uint32 offset, Js::ArgSlot argument, Js::RegSlot srcRegSlot)
{
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));

    IR::Instr *     instr;
    IRType type = TyVar;
    if (newOpcode == Js::OpCode::ArgOut_ANonVar)
    {
        newOpcode = Js::OpCode::ArgOut_A;
        type = TyMachPtr;
    }
    m_argsOnStack++;
    StackSym *      symDst;

    Assert(argument < USHRT_MAX);
    symDst = m_func->m_symTable->GetArgSlotSym((uint16)(argument+1));
    if (symDst == nullptr || (uint16)(argument + 1) != (argument + 1))
    {
        AssertMsg(UNREACHED, "Arg count too big...");
        Fatal();
    }

    IR::SymOpnd * dstOpnd = IR::SymOpnd::New(symDst, type, m_func);
    IR::RegOpnd *  src1Opnd = this->BuildSrcOpnd(srcRegSlot, type);
    instr = IR::Instr::New(newOpcode, dstOpnd, src1Opnd, m_func);

    this->AddInstr(instr, offset);

    m_argStack->Push(instr);
}